

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O1

void optimal_out(_output_ctx *out,_encode_match_data *emd)

{
  undefined8 *puVar1;
  interval_nodep inp1;
  
  puVar1 = *(undefined8 **)((long)emd->priv + 0x28);
  inp1 = *(interval_nodep *)((long)emd->priv + 0x30);
  interval_out(out,(interval_nodep)*puVar1,4);
  interval_out(out,(interval_nodep)puVar1[1],0x10);
  interval_out(out,(interval_nodep)puVar1[7],0x10);
  interval_out(out,inp1,0x10);
  return;
}

Assistant:

void optimal_out(output_ctx out,        /* IN/OUT */
                 encode_match_data emd) /* IN */
{
    encode_match_privp data;
    interval_nodep *offset;
    interval_nodep len;

    data = emd->priv;

    offset = data->offset_f_priv;
    len = data->len_f_priv;

    interval_out(out, offset[0], 4);
    interval_out(out, offset[1], 16);
    interval_out(out, offset[7], 16);
    interval_out(out, len, 16);
}